

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O2

int svc_xprt_init(void)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&svc_xprt_fd);
  iVar1 = 0;
  if (initialized == '\0') {
    iVar1 = rbtx_init(&svc_xprt_fd.xt,svc_xprt_fd_cmpf,0xc1,1);
    if ((iVar1 != 0) && ((__ntirpc_pkg_params.debug_flags._2_1_ & 0x20) != 0)) {
      (*__ntirpc_pkg_params.warnx_)("svc_xprt_init: rbtx_init failed");
    }
    initialized = '\x01';
  }
  pthread_mutex_unlock((pthread_mutex_t *)&svc_xprt_fd);
  return iVar1;
}

Assistant:

int
svc_xprt_init(void)
{
	int code = 0;

	mutex_lock(&svc_xprt_fd.lock);

	if (initialized)
		goto unlock;

	/* one of advantages of this RBT is convenience of external
	 * iteration, we'll go to that shortly */
	code =
	    rbtx_init(&svc_xprt_fd.xt, svc_xprt_fd_cmpf /* NULL (inline) */ ,
		      SVC_XPRT_PARTITIONS, RBT_X_FLAG_ALLOC);
	if (code)
		__warnx(TIRPC_DEBUG_FLAG_SVC_XPRT,
			"svc_xprt_init: rbtx_init failed");

	initialized = true;

 unlock:
	mutex_unlock(&svc_xprt_fd.lock);
	return (code);
}